

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cui.hpp
# Opt level: O0

void __thiscall ghc::cui::window_base::drawBox(window_base *this,int x,int y,int w,int h)

{
  int iVar1;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  window_base *this_local;
  
  if ((1 < w) && (1 < h)) {
    iVar1 = wmove(_stdscr,this->_ypos + y,this->_xpos + x);
    if (iVar1 != -1) {
      waddch(_stdscr,_ASN1_STRING_length);
    }
    iVar1 = wmove(_stdscr,this->_ypos + y,this->_xpos + x + w + -1);
    if (iVar1 != -1) {
      waddch(_stdscr,_DAT_00367584);
    }
    iVar1 = wmove(_stdscr,this->_ypos + y + h + -1,this->_xpos + x);
    if (iVar1 != -1) {
      waddch(_stdscr,_DAT_0036758c);
    }
    iVar1 = wmove(_stdscr,this->_ypos + y + h + -1,this->_xpos + x + w + -1);
    if (iVar1 != -1) {
      waddch(_stdscr,_erase);
    }
    drawHLine(this,x + 1,y,w + -2,0,0);
    drawHLine(this,x + 1,y + h + -1,w + -2,0,0);
    drawVLine(this,x,y + 1,h + -2);
    drawVLine(this,x + w + -1,y + 1,h + -2);
  }
  return;
}

Assistant:

GHC_INLINE void window_base::drawBox(int x, int y, int w, int h)
{
    if (w >= 2 && h >= 2) {
        mvaddch(_ypos + y, _xpos + x, ACS_ULCORNER);
        mvaddch(_ypos + y, _xpos + x + w - 1, ACS_URCORNER);
        mvaddch(_ypos + y + h - 1, _xpos + x, ACS_LLCORNER);
        mvaddch(_ypos + y + h - 1, _xpos + x + w - 1, ACS_LRCORNER);
        drawHLine(x + 1, y, w - 2);
        drawHLine(x + 1, y + h - 1, w - 2);
        drawVLine(x, y + 1, h - 2);
        drawVLine(x + w - 1, y + 1, h - 2);
    }
}